

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_2x2.h
# Opt level: O1

void ncnn::pooling2x2s2_max_avx(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  long lVar10;
  undefined1 (*pauVar11) [16];
  undefined1 (*pauVar12) [32];
  long lVar13;
  undefined1 (*pauVar14) [32];
  
  iVar1 = bottom_blob->c;
  if (0 < (long)iVar1) {
    iVar2 = top_blob->h;
    iVar3 = bottom_blob->w;
    uVar4 = top_blob->w;
    lVar10 = (long)(int)((iVar3 - uVar4) * 2);
    lVar13 = 0;
    do {
      if (0 < iVar2) {
        pauVar14 = (undefined1 (*) [32])
                   (bottom_blob->cstep * lVar13 * bottom_blob->elemsize + (long)bottom_blob->data);
        pauVar12 = (undefined1 (*) [32])(*pauVar14 + (long)iVar3 * 4);
        pauVar11 = (undefined1 (*) [16])
                   (top_blob->cstep * lVar13 * top_blob->elemsize + (long)top_blob->data);
        iVar9 = 0;
        do {
          iVar8 = ((int)uVar4 >> 2) + 1;
          if (0 < (int)uVar4 >> 2) {
            do {
              auVar6 = vmaxps_avx(*pauVar14,*pauVar12);
              auVar6 = vshufps_avx(auVar6,auVar6,0xd8);
              auVar6 = vpermpd_avx2(auVar6,0xd8);
              auVar5 = vmaxps_avx(auVar6._0_16_,auVar6._16_16_);
              *pauVar11 = auVar5;
              pauVar14 = pauVar14 + 1;
              pauVar12 = pauVar12 + 1;
              pauVar11 = pauVar11 + 1;
              iVar8 = iVar8 + -1;
            } while (1 < iVar8);
          }
          iVar8 = (uVar4 & 3) + 1;
          if ((uVar4 & 3) != 0) {
            do {
              auVar5 = vmaxss_avx(ZEXT416(*(uint *)(*pauVar14 + 4)),ZEXT416(*(uint *)*pauVar14));
              auVar7 = vmaxss_avx(ZEXT416(*(uint *)(*pauVar12 + 4)),ZEXT416(*(uint *)*pauVar12));
              auVar5 = vmaxss_avx(auVar7,auVar5);
              *(int *)*pauVar11 = auVar5._0_4_;
              pauVar14 = (undefined1 (*) [32])(*pauVar14 + 8);
              pauVar12 = (undefined1 (*) [32])(*pauVar12 + 8);
              pauVar11 = (undefined1 (*) [16])(*pauVar11 + 4);
              iVar8 = iVar8 + -1;
            } while (1 < iVar8);
          }
          pauVar14 = (undefined1 (*) [32])(*pauVar14 + lVar10 * 4);
          pauVar12 = (undefined1 (*) [32])(*pauVar12 + lVar10 * 4);
          iVar9 = iVar9 + 1;
        } while (iVar9 != iVar2);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != iVar1);
  }
  return;
}

Assistant:

static void pooling2x2s2_max_avx(const Mat& bottom_blob, Mat& top_blob,
                                 const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int tailstep = w - 2 * outw + w;
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < inch; q++)
    {
        const float* img0 = bottom_blob.channel(q);
        float* outptr = top_blob.channel(q);
        int outcount = 0;
        const float* r0 = img0;
        const float* r1 = img0 + w;
#if __AVX2__
        __m256i permute_mask = _mm256_setr_epi32(0, 2, 4, 6, 1, 3, 5, 7);
#endif // __AVX__

        for (int i = 0; i < outh; i++)
        {
#if __AVX2__
            int nn = outw >> 2;
            int remain = outw - (nn << 2);
#else
            int remain = outw;
#endif // __AVX__

#if __AVX2__
            for (; nn > 0; nn--)
            {
                __m256 _r0 = _mm256_loadu_ps(r0);
                __m256 _r1 = _mm256_loadu_ps(r1);
                __m256 _max_r0_r1 = _mm256_max_ps(_r0, _r1);
                _max_r0_r1 = _mm256_castsi256_ps(_mm256_permutevar8x32_epi32(
                                                     _mm256_castps_si256(_max_r0_r1), permute_mask));
                __m128 _max_0 = _mm256_extractf128_ps(_max_r0_r1, 0);
                __m128 _max_1 = _mm256_extractf128_ps(_max_r0_r1, 1);
                __m128 _max = _mm_max_ps(_max_0, _max_1);
                _mm_storeu_ps(outptr, _max);
                r0 += 8;
                r1 += 8;
                outptr += 4;
                outcount += 4;
            }
#endif // __AVX__
            for (; remain > 0; remain--)
            {
                float max0 = std::max(r0[0], r0[1]);
                float max1 = std::max(r1[0], r1[1]);

                *outptr = std::max(max0, max1);

                r0 += 2;
                r1 += 2;
                outptr++;
                outcount++;
            }
            r0 += tailstep;
            r1 += tailstep;
        }
    }
}